

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_rope_back(ggml_compute_params *params,ggml_tensor *dst)

{
  long in_RSI;
  ggml_tensor *src0;
  bool in_stack_00000247;
  ggml_tensor *in_stack_00000248;
  ggml_compute_params *in_stack_00000250;
  bool in_stack_000003b7;
  ggml_tensor *in_stack_000003b8;
  ggml_compute_params *in_stack_000003c0;
  
  if (**(int **)(in_RSI + 0x98) == 0) {
    ggml_compute_forward_rope_f32(in_stack_00000250,in_stack_00000248,in_stack_00000247);
  }
  else if (**(int **)(in_RSI + 0x98) == 1) {
    ggml_compute_forward_rope_f16(in_stack_000003c0,in_stack_000003b8,in_stack_000003b7);
  }
  else {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x157b,"fatal error");
  }
  return;
}

Assistant:

void ggml_compute_forward_rope_back(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_rope_f16(params, dst, false);
            } break;
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_rope_f32(params, dst, false);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}